

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int LoadEXRFromMemory(float *out_rgba,uchar *memory,char **err)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  float fVar11;
  EXRImage exrImage;
  
  if (out_rgba == (float *)0x0 || memory == (uchar *)0x0) {
    if (err != (char **)0x0) {
      *err = "Invalid argument.\n";
      return -1;
    }
    return -1;
  }
  exrImage.images = (uchar **)0x0;
  exrImage.pixel_types = (int *)0x0;
  exrImage.num_custom_attributes = 0;
  exrImage.num_channels = 0;
  exrImage.channel_names = (char **)0x0;
  exrImage.requested_pixel_types = (int *)0x0;
  iVar2 = LoadMultiChannelEXRFromMemory(&exrImage,memory,err);
  if (iVar2 != 0) {
    return iVar2;
  }
  uVar9 = 0;
  uVar8 = (ulong)(uint)exrImage.num_channels;
  if (exrImage.num_channels < 1) {
    uVar8 = uVar9;
  }
  uVar3 = 0xffffffffffffffff;
  uVar7 = 0xffffffff;
  uVar6 = 0xffffffff;
  uVar5 = 0xffffffff;
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    pcVar4 = exrImage.channel_names[uVar9];
    cVar1 = *pcVar4;
    if (cVar1 == 'R') {
      if (pcVar4[1] == '\0') {
        uVar3 = uVar9 & 0xffffffff;
      }
    }
    else if (cVar1 == 'A') {
      if (pcVar4[1] == '\0') {
        uVar5 = uVar9 & 0xffffffff;
      }
    }
    else if (cVar1 == 'B') {
      if (pcVar4[1] == '\0') {
        uVar6 = uVar9 & 0xffffffff;
      }
    }
    else if ((cVar1 == 'G') && (pcVar4[1] == '\0')) {
      uVar7 = uVar9 & 0xffffffff;
    }
  }
  if ((int)uVar3 == -1) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar4 = "R channel not found\n";
  }
  else if ((int)uVar7 == -1) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar4 = "G channel not found\n";
  }
  else {
    if ((int)uVar6 != -1) {
      uVar8 = (ulong)(uint)(exrImage.height * exrImage.width);
      if (exrImage.height * exrImage.width < 1) {
        uVar8 = 0;
      }
      for (lVar10 = 0; uVar8 * 4 != lVar10; lVar10 = lVar10 + 4) {
        out_rgba[lVar10] = *(float *)(exrImage.images[(int)uVar3] + lVar10);
        out_rgba[lVar10 + 1] = *(float *)(exrImage.images[(int)uVar7] + lVar10);
        out_rgba[lVar10 + 2] = *(float *)(exrImage.images[(int)uVar6] + lVar10);
        fVar11 = 1.0;
        if (0 < (int)uVar5) {
          fVar11 = *(float *)(exrImage.images[uVar5] + lVar10);
        }
        out_rgba[lVar10 + 3] = fVar11;
      }
      return 0;
    }
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar4 = "B channel not found\n";
  }
  *err = pcVar4;
  return -1;
}

Assistant:

int LoadEXRFromMemory(float *out_rgba, const unsigned char *memory,
                      const char **err) {

  if (out_rgba == NULL || memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }
    return -1;
  }

  EXRImage exrImage;
  InitEXRImage(&exrImage);
  int ret = LoadMultiChannelEXRFromMemory(&exrImage, memory, err);
  if (ret != 0) {
    return ret;
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exrImage.num_channels; c++) {
    if (strcmp(exrImage.channel_names[c], "R") == 0) {
      idxR = c;
    } else if (strcmp(exrImage.channel_names[c], "G") == 0) {
      idxG = c;
    } else if (strcmp(exrImage.channel_names[c], "B") == 0) {
      idxB = c;
    } else if (strcmp(exrImage.channel_names[c], "A") == 0) {
      idxA = c;
    }
  }

  if (idxR == -1) {
    if (err) {
      (*err) = "R channel not found\n";
    }

    // @todo { free exrImage }
    return -1;
  }

  if (idxG == -1) {
    if (err) {
      (*err) = "G channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  if (idxB == -1) {
    if (err) {
      (*err) = "B channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  // Assume `out_rgba` have enough memory allocated.
  for (int i = 0; i < exrImage.width * exrImage.height; i++) {
    out_rgba[4 * i + 0] = reinterpret_cast<float **>(exrImage.images)[idxR][i];
    out_rgba[4 * i + 1] = reinterpret_cast<float **>(exrImage.images)[idxG][i];
    out_rgba[4 * i + 2] = reinterpret_cast<float **>(exrImage.images)[idxB][i];
    if (idxA > 0) {
      out_rgba[4 * i + 3] =
          reinterpret_cast<float **>(exrImage.images)[idxA][i];
    } else {
      out_rgba[4 * i + 3] = 1.0;
    }
  }

  return 0;
}